

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O3

bool __thiscall QRadioButton::event(QRadioButton *this,QEvent *e)

{
  bool bVar1;
  
  if (*(short *)(e + 8) == 100) {
    QWidgetPrivate::setLayoutItemMargins
              (*(QWidgetPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8,
               SE_RadioButtonLayoutItem,(QStyleOption *)0x0);
  }
  bVar1 = QAbstractButton::event(&this->super_QAbstractButton,e);
  return bVar1;
}

Assistant:

bool QRadioButton::event(QEvent *e)
{
    Q_D(QRadioButton);
    if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || e->type() == QEvent::MacSizeChange
#endif
            )
        d->setLayoutItemMargins(QStyle::SE_RadioButtonLayoutItem);
    return QAbstractButton::event(e);
}